

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string1.cpp
# Opt level: O2

void __thiscall String::String(String *this,char *str)

{
  ostream *poVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"String constructor!");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (str == (char *)0x0) {
    pcVar3 = (char *)operator_new__(1);
    this->m_data = pcVar3;
    *pcVar3 = '\0';
    sVar4 = 0;
  }
  else {
    sVar2 = strlen(str);
    pcVar3 = (char *)operator_new__((long)((int)sVar2 + 1));
    this->m_data = pcVar3;
    strcpy(pcVar3,str);
    sVar4 = (size_t)(int)sVar2;
  }
  this->m_size = sVar4;
  return;
}

Assistant:

String::String(const char* str)
{
	cout << "String constructor!" << endl;
	if (str == nullptr) {
		m_data = new char[1];
		*m_data = '\0';
		m_size = 0;

	} else {
		int length = strlen(str);
		m_data = new char[length + 1];
		strcpy(m_data, str);
		m_size = length;
	}
}